

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level.cxx
# Opt level: O3

void __thiscall xray_re::xr_level::~xr_level(xr_level *this)

{
  xr_level_wallmarks *this_00;
  pointer ppxVar1;
  pointer ppxVar2;
  
  this->_vptr_xr_level = (_func_int **)&PTR__xr_level_002499d8;
  if (this->m_ltx != (xr_level_ltx *)0x0) {
    (*this->m_ltx->_vptr_xr_level_ltx[1])();
  }
  if (this->m_geom != (xr_level_geom *)0x0) {
    (*this->m_geom->_vptr_xr_level_geom[1])();
  }
  if (this->m_geomx != (xr_level_geom *)0x0) {
    (*this->m_geomx->_vptr_xr_level_geom[1])();
  }
  if (this->m_visuals != (xr_level_visuals *)0x0) {
    (*this->m_visuals->_vptr_xr_level_visuals[1])();
  }
  if (this->m_shaders != (xr_level_shaders *)0x0) {
    (*this->m_shaders->_vptr_xr_level_shaders[1])();
  }
  if (this->m_sectors != (xr_level_sectors *)0x0) {
    (*this->m_sectors->_vptr_xr_level_sectors[1])();
  }
  if (this->m_portals != (xr_level_portals *)0x0) {
    (*this->m_portals->_vptr_xr_level_portals[1])();
  }
  if (this->m_lights != (xr_level_lights *)0x0) {
    (*this->m_lights->_vptr_xr_level_lights[1])();
  }
  if (this->m_glows != (xr_level_glows *)0x0) {
    (*this->m_glows->_vptr_xr_level_glows[1])();
  }
  if (this->m_hom != (xr_level_hom *)0x0) {
    (*this->m_hom->_vptr_xr_level_hom[1])();
  }
  if (this->m_cform != (xr_level_cform *)0x0) {
    (*(this->m_cform->super_xr_cform)._vptr_xr_cform[1])();
  }
  if (this->m_details != (xr_level_details *)0x0) {
    (*this->m_details->_vptr_xr_level_details[1])();
  }
  if (this->m_ai != (xr_level_ai *)0x0) {
    (*this->m_ai->_vptr_xr_level_ai[1])();
  }
  if (this->m_game != (xr_level_game *)0x0) {
    (*this->m_game->_vptr_xr_level_game[1])();
  }
  if (this->m_spawn != (xr_level_spawn *)0x0) {
    (*this->m_spawn->_vptr_xr_level_spawn[1])();
  }
  this_00 = this->m_wallmarks;
  if (this_00 != (xr_level_wallmarks *)0x0) {
    xr_level_wallmarks::~xr_level_wallmarks(this_00);
  }
  operator_delete(this_00,0x18);
  if (this->m_som != (xr_level_som *)0x0) {
    (*this->m_som->_vptr_xr_level_som[1])();
  }
  if (this->m_snd_env != (xr_level_snd_env *)0x0) {
    (*(this->m_snd_env->super_xr_cform)._vptr_xr_cform[1])();
  }
  if (this->m_snd_static != (xr_level_snd_static *)0x0) {
    (*this->m_snd_static->_vptr_xr_level_snd_static[1])();
  }
  if (this->m_ps_static != (xr_level_ps_static *)0x0) {
    (*this->m_ps_static->_vptr_xr_level_ps_static[1])();
  }
  if (this->m_env_mod != (xr_level_env_mod *)0x0) {
    (*this->m_env_mod->_vptr_xr_level_env_mod[1])();
  }
  if (this->m_fog_vol != (xr_level_fog_vol *)0x0) {
    (*this->m_fog_vol->_vptr_xr_level_fog_vol[1])();
  }
  if (this->m_build_lights != (xr_build_lights *)0x0) {
    (*this->m_build_lights->_vptr_xr_build_lights[1])();
  }
  if (this->m_lods != (xr_image *)0x0) {
    (*this->m_lods->_vptr_xr_image[1])();
  }
  if (this->m_lods_nm != (xr_image *)0x0) {
    (*this->m_lods_nm->_vptr_xr_image[1])();
  }
  ppxVar1 = (this->m_brkbl_meshes).
            super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppxVar2 = (this->m_brkbl_meshes).
                 super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppxVar2 != ppxVar1; ppxVar2 = ppxVar2 + 1) {
    if (*ppxVar2 != (xr_ogf *)0x0) {
      (*((*ppxVar2)->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[1])();
    }
  }
  if (this->m_gamemtls_lib != (xr_gamemtls_lib *)0x0) {
    (*this->m_gamemtls_lib->_vptr_xr_gamemtls_lib[1])();
  }
  ppxVar2 = (this->m_brkbl_meshes).
            super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppxVar2 != (pointer)0x0) {
    operator_delete(ppxVar2,(long)(this->m_brkbl_meshes).
                                  super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppxVar2
                   );
    return;
  }
  return;
}

Assistant:

xr_level::~xr_level()
{
	delete m_ltx;
	delete m_geom;
	delete m_geomx;
	delete m_visuals;
	delete m_shaders;
	delete m_sectors;
	delete m_portals;
	delete m_lights;
	delete m_glows;
	delete m_hom;
	delete m_cform;
	delete m_details;
	delete m_ai;
	delete m_game;
	delete m_spawn;
	delete m_wallmarks;
	delete m_som;
	delete m_snd_env;
	delete m_snd_static;
	delete m_ps_static;
	delete m_env_mod;
	delete m_fog_vol;
	delete m_build_lights;
	delete m_lods;
	delete m_lods_nm;
	delete_elements(m_brkbl_meshes);
	delete m_gamemtls_lib;
}